

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O3

void __thiscall re2::Prog::Fanout(Prog *this,SparseArray<int> *fanout)

{
  int *piVar1;
  ostream *poVar2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false> _Var4;
  uint *puVar5;
  IndexValue *pIVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  Inst *pIVar10;
  _Head_base<0UL,_int_*,_false> _Var11;
  long lVar12;
  SparseSet reachable;
  SparseSetT<void> local_1e0;
  IndexValue *local_1b8;
  LogMessage local_1b0;
  
  SparseSetT<void>::SparseSetT(&local_1e0,this->size_);
  fanout->size_ = 0;
  pIVar6 = (fanout->dense_).ptr_._M_t.
           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
  if ((pIVar6 != (IndexValue *)0x0) &&
     (_Var4._M_head_impl.len_ = (Deleter)this->start_,
     (uint)_Var4._M_head_impl.len_ <
     (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                    super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                    ._M_t.
                    super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                    .
                    super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
     )) {
    piVar1 = (fanout->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>.
             _M_t.super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    piVar1[(int)_Var4._M_head_impl.len_] = 0;
    pIVar6->index_ = (int)_Var4._M_head_impl.len_;
    fanout->size_ = 1;
    pIVar6[piVar1[(int)_Var4._M_head_impl.len_]].value_ = 0;
    _Var3._M_head_impl =
         local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    _Var11._M_head_impl =
         local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
         super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl;
    local_1b8 = pIVar6;
    do {
      local_1e0.size_ = 0;
      if (((uint *)_Var11._M_head_impl != (uint *)0x0) &&
         (uVar9 = local_1b8->index_,
         uVar9 < (uint)local_1e0.dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_))
      {
        local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar9] = 0;
        *_Var11._M_head_impl = uVar9;
        local_1e0.size_ = 1;
        puVar7 = (uint *)_Var11._M_head_impl + 1;
        uVar9 = *_Var11._M_head_impl;
        lVar12 = (long)(int)uVar9;
        pIVar10 = (this->inst_).ptr_._M_t.
                  super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                  _M_t.
                  super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                  .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        uVar8 = pIVar10[lVar12].out_opcode_;
        puVar5 = (uint *)_Var11._M_head_impl;
        switch(uVar8 & 7) {
        case 0:
          goto switchD_001ce588_caseD_0;
        case 1:
          goto switchD_001ce588_caseD_1;
        case 2:
          goto switchD_001ce588_caseD_2;
        default:
          goto switchD_001ce588_caseD_3;
        case 5:
          goto switchD_001ce588_caseD_5;
        case 7:
          goto switchD_001ce588_caseD_7;
        }
      }
LAB_001ce78b:
      local_1b8 = local_1b8 + 1;
    } while (local_1b8 != pIVar6 + fanout->size_);
  }
  SparseSetT<void>::~SparseSetT(&local_1e0);
  return;
  do {
    uVar9 = *_Var11._M_head_impl;
    lVar12 = (long)(int)uVar9;
    pIVar10 = (this->inst_).ptr_._M_t.
              super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
              super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
              super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar8 = pIVar10[lVar12].out_opcode_;
    puVar5 = (uint *)_Var3._M_head_impl;
    switch(uVar8 & 7) {
    case 0:
switchD_001ce588_caseD_0:
      LogMessage::LogMessage
                (&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/nfa.cc"
                 ,0x2cf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0.str_,"unhandled ",10)
      ;
      poVar2 = (ostream *)
               std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar10[lVar12].out_opcode_ & 7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," in Prog::Fanout()",0x12);
      LogMessage::~LogMessage(&local_1b0);
      _Var3._M_head_impl =
           local_1e0.dense_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
           super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
    case 7:
switchD_001ce588_caseD_7:
      _Var11._M_head_impl = _Var11._M_head_impl + 1;
      puVar7 = (uint *)_Var3._M_head_impl + local_1e0.size_;
      if ((uint *)_Var11._M_head_impl == puVar7) {
        pIVar6 = (fanout->dense_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                 .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
        _Var11._M_head_impl = _Var3._M_head_impl;
        goto LAB_001ce78b;
      }
      break;
    case 2:
switchD_001ce588_caseD_2:
      if (((((uVar8 & 8) == 0) && (puVar5 != (uint *)0x0)) &&
          (uVar9 = (int)lVar12 + 1,
          uVar9 < (uint)local_1e0.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                        super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)
          ) && (((uint)local_1e0.size_ <=
                 (uint)local_1e0.sparse_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar12 + 1] ||
                (puVar5[local_1e0.sparse_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar12 + 1]] != uVar9)))) {
        local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar12 + 1] = local_1e0.size_;
        *puVar7 = uVar9;
        local_1e0.size_ = local_1e0.size_ + 1;
      }
      local_1b8->value_ = local_1b8->value_ + 1;
      pIVar6 = (fanout->dense_).ptr_._M_t.
               super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
               .super__Head_base<0UL,_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl;
      if (pIVar6 != (IndexValue *)0x0) {
        _Var4._M_head_impl.len_ = (Deleter)(pIVar10[lVar12].out_opcode_ >> 4);
        if ((uint)_Var4._M_head_impl.len_ <
            (uint)*(int *)&(fanout->dense_).ptr_._M_t.
                           super___uniq_ptr_impl<re2::SparseArray<int>::IndexValue,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           ._M_t.
                           super__Tuple_impl<0UL,_re2::SparseArray<int>::IndexValue_*,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Tuple_impl<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter>
                           .
                           super__Head_base<1UL,_re2::PODArray<re2::SparseArray<int>::IndexValue>::Deleter,_false>
           ) {
          piVar1 = (fanout->sparse_).ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          uVar9 = fanout->size_;
          if ((uVar9 <= (uint)piVar1[(uint)_Var4._M_head_impl.len_]) ||
             ((Deleter)pIVar6[piVar1[(uint)_Var4._M_head_impl.len_]].index_ !=
              _Var4._M_head_impl.len_)) {
            piVar1[(uint)_Var4._M_head_impl.len_] = uVar9;
            pIVar6[(int)uVar9].index_ = (int)_Var4._M_head_impl.len_;
            fanout->size_ = uVar9 + 1;
            pIVar6[piVar1[(uint)_Var4._M_head_impl.len_]].value_ = 0;
          }
        }
      }
      goto switchD_001ce588_caseD_7;
    default:
switchD_001ce588_caseD_3:
      if (((((uVar8 & 8) == 0) && (puVar5 != (uint *)0x0)) &&
          (uVar9 = (int)lVar12 + 1,
          uVar9 < (uint)local_1e0.dense_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                        super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_)
          ) && (((uint)local_1e0.size_ <=
                 (uint)local_1e0.sparse_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar12 + 1] ||
                (puVar5[local_1e0.sparse_.ptr_._M_t.
                        super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar12 + 1]] != uVar9)))) {
        local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
        super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar12 + 1] = local_1e0.size_;
        *puVar7 = uVar9;
        local_1e0.size_ = local_1e0.size_ + 1;
        uVar8 = pIVar10[lVar12].out_opcode_;
      }
      if ((puVar5 != (uint *)0x0) &&
         (uVar8 = uVar8 >> 4,
         uVar8 < (uint)local_1e0.dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_))
      {
        if (((uint)local_1e0.size_ <=
             (uint)local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar8]) ||
           (puVar5[local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar8]] != uVar8)) {
          local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[uVar8] = local_1e0.size_;
          puVar5[local_1e0.size_] = uVar8;
          goto LAB_001ce77b;
        }
      }
      goto switchD_001ce588_caseD_7;
    case 5:
switchD_001ce588_caseD_5:
      if ((uVar8 & 8) != 0) goto switchD_001ce588_caseD_7;
    case 1:
switchD_001ce588_caseD_1:
      if ((puVar5 != (uint *)0x0) &&
         (uVar9 = uVar9 + 1,
         uVar9 < (uint)local_1e0.dense_.ptr_._M_t.
                       super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_re2::PODArray<int>::Deleter,_false>._M_head_impl.len_))
      {
        if (((uint)local_1e0.size_ <=
             (uint)local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar9]) ||
           (puVar5[local_1e0.sparse_.ptr_._M_t.
                   super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
                   super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar9]] != uVar9)) {
          local_1e0.sparse_.ptr_._M_t.super___uniq_ptr_impl<int,_re2::PODArray<int>::Deleter>._M_t.
          super__Tuple_impl<0UL,_int_*,_re2::PODArray<int>::Deleter>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)uVar9] = local_1e0.size_;
          *puVar7 = uVar9;
LAB_001ce77b:
          local_1e0.size_ = local_1e0.size_ + 1;
        }
      }
      goto switchD_001ce588_caseD_7;
    }
  } while( true );
}

Assistant:

void Prog::Fanout(SparseArray<int>* fanout) {
  DCHECK_EQ(fanout->max_size(), size());
  SparseSet reachable(size());
  fanout->clear();
  fanout->set_new(start(), 0);
  for (SparseArray<int>::iterator i = fanout->begin(); i != fanout->end(); ++i) {
    int* count = &i->value();
    reachable.clear();
    reachable.insert(i->index());
    for (SparseSet::iterator j = reachable.begin(); j != reachable.end(); ++j) {
      int id = *j;
      Prog::Inst* ip = inst(id);
      switch (ip->opcode()) {
        default:
          LOG(DFATAL) << "unhandled " << ip->opcode() << " in Prog::Fanout()";
          break;

        case kInstByteRange:
          if (!ip->last())
            reachable.insert(id+1);

          (*count)++;
          if (!fanout->has_index(ip->out())) {
            fanout->set_new(ip->out(), 0);
          }
          break;

        case kInstAltMatch:
          DCHECK(!ip->last());
          reachable.insert(id+1);
          break;

        case kInstCapture:
        case kInstEmptyWidth:
        case kInstNop:
          if (!ip->last())
            reachable.insert(id+1);

          reachable.insert(ip->out());
          break;

        case kInstMatch:
          if (!ip->last())
            reachable.insert(id+1);
          break;

        case kInstFail:
          break;
      }
    }
  }
}